

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

int xmlListRemoveFirst(xmlListPtr l,void *data)

{
  xmlLinkPtr lk_00;
  xmlLinkPtr lk;
  void *data_local;
  xmlListPtr l_local;
  
  if (l == (xmlListPtr)0x0) {
    l_local._4_4_ = 0;
  }
  else {
    lk_00 = xmlListLinkSearch(l,data);
    if (lk_00 == (xmlLinkPtr)0x0) {
      l_local._4_4_ = 0;
    }
    else {
      xmlLinkDeallocator(l,lk_00);
      l_local._4_4_ = 1;
    }
  }
  return l_local._4_4_;
}

Assistant:

int
xmlListRemoveFirst(xmlListPtr l, void *data)
{
    xmlLinkPtr lk;

    if (l == NULL)
        return(0);
    /*Find the first instance of this data */
    lk = xmlListLinkSearch(l, data);
    if (lk != NULL) {
        xmlLinkDeallocator(l, lk);
        return 1;
    }
    return 0;
}